

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderCableANCF::BuildBeam
          (ChBuilderCableANCF *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCable> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *nodes,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *node_nbrs)

{
  pointer pvVar1;
  pointer pvVar2;
  ChMesh *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *peVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  shared_ptr<chrono::fea::ChBeamSectionCable> *this_00;
  int iVar12;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *pvVar13;
  double dVar14;
  double dVar15;
  int local_154;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *local_150;
  long local_148;
  shared_ptr<chrono::fea::ChMesh> *local_140;
  int local_134;
  shared_ptr<chrono::fea::ChElementCableANCF> element;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeA;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  ChVector<double> v_1;
  __shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2> local_58;
  ChVector<double> v;
  
  local_140 = mesh;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
  ::clear(&this->beam_elems);
  pvVar13 = &this->beam_nodes;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::clear(pvVar13);
  uVar10 = ((long)(nodes->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(nodes->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pvVar1 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_148 = CONCAT44(local_148._4_4_,N);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(nodes,uVar10 + (long)N);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(node_nbrs,(long)N + 1 + ((long)pvVar1 - (long)pvVar2) / 0x18);
  v.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])B->m_data,*(undefined1 (*) [16])A->m_data);
  v.m_data[2] = B->m_data[2] - A->m_data[2];
  ChVector<double>::Normalize(&v);
  dVar14 = 1.0 / (double)N;
  auVar4 = vsubpd_avx(*(undefined1 (*) [16])B->m_data,*(undefined1 (*) [16])A->m_data);
  v_1.m_data[2] = dVar14 * (B->m_data[2] - A->m_data[2]);
  v_1.m_data[0] = dVar14 * auVar4._0_8_;
  v_1.m_data[1] = dVar14 * auVar4._8_8_;
  dVar14 = ChVector<double>::Length(&v_1);
  std::
  make_shared<chrono::fea::ChNodeFEAxyzD,chrono::ChVector<double>const&,chrono::ChVector<double>&>
            ((ChVector<double> *)
             &nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>,A);
  pCVar3 = (local_140->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzD,void>
            (local_88,&nodeA.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>);
  ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  local_150 = pvVar13;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::push_back(pvVar13,&nodeA);
  uVar7 = ~((int)(uint)local_148 >> 0x1f) & (uint)local_148;
  local_148 = uVar10 * 0x18;
  iVar8 = 1;
  for (lVar11 = 0; (ulong)uVar7 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
    auVar4 = *(undefined1 (*) [16])A->m_data;
    dVar15 = (double)iVar8 / (double)N;
    auVar5 = vsubpd_avx(*(undefined1 (*) [16])B->m_data,auVar4);
    v_1.m_data[2] = A->m_data[2] + dVar15 * (B->m_data[2] - A->m_data[2]);
    v_1.m_data[0] = auVar4._0_8_ + dVar15 * auVar5._0_8_;
    v_1.m_data[1] = auVar4._8_8_ + dVar15 * auVar5._8_8_;
    local_134 = iVar8;
    std::make_shared<chrono::fea::ChNodeFEAxyzD,chrono::ChVector<double>&,chrono::ChVector<double>&>
              ((ChVector<double> *)
               &nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>,
               &v_1);
    pCVar3 = (local_140->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzD,void>
              (local_98,&nodeB.
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
    ::push_back(local_150,
                (value_type *)
                &nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>);
    chrono_types::make_shared<chrono::fea::ChElementCableANCF,_0>();
    std::
    vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
    ::push_back(&this->beam_elems,
                (value_type *)
                &element.
                 super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>);
    peVar6 = element.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pvVar13 = local_150;
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_150->
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar11));
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(pvVar13->
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar11));
    (*(peVar6->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1a])(peVar6,&local_a8,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    this_00 = &(element.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->section;
    std::__shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &sect->
                super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->
                super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>,
               &local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    ((element.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_ChElementBeam).length = dVar14;
    pCVar3 = (local_140->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementCableANCF,void>
              (local_c8,&element.
                         super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMesh::AddElement(pCVar3,(shared_ptr<chrono::fea::ChElementBase> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
    pvVar1 = (nodes->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_154 = (**(code **)(**(long **)((long)&(((local_150->
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11) + 0x28))();
    local_154 = local_154 + -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + local_148),&local_154);
    pvVar1 = (nodes->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_154 = (**(code **)(**(long **)((long)&(((local_150->
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar11) + 0x28))();
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + local_148),&local_154);
    iVar8 = (**(code **)(**(long **)((long)&(((local_150->
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11) + 0x28))();
    iVar12 = (int)uVar10;
    local_154 = iVar12;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + (iVar8 - 1),&local_154);
    uVar9 = (**(code **)(**(long **)((long)&(((local_150->
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11) + 0x28))();
    local_154 = iVar12;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar9,&local_154);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&element.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_148 = local_148 + 0x18;
    uVar10 = (ulong)(iVar12 + 1);
    iVar8 = local_134 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChBuilderCableANCF::BuildBeam(std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionCable> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B,                        // ending point
                                   std::vector<std::vector<int>>& nodes,      // node indices for all elements
                                   std::vector<std::vector<int>>& node_nbrs   // neighbor node indices (connectivity)
) {
    beam_elems.clear();
    beam_nodes.clear();
    auto n_nodes = nodes.size();
    auto n_nbrs = node_nbrs.size();

    nodes.resize(N + n_nodes);
    node_nbrs.resize(N + 1 + n_nbrs);
    ChVector<> bdir = (B - A);
    bdir.Normalize();

    double restlength = ((B - A) / N).Length();

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzD>(A, bdir);
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 0; i < N; i++) {
        double eta = (i + 1.0) / N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzD>(pos, bdir);
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementCableANCF>();

        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i], beam_nodes[i + 1]);

        element->SetSection(sect);

        element->SetRestLength(restlength);
        
        mesh->AddElement(element);

        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex() - 1);
        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex());

        node_nbrs[beam_nodes[i]->GetIndex() - 1].push_back((int)n_nodes + i);
        node_nbrs[beam_nodes[i]->GetIndex()].push_back((int)n_nodes + i);
    }
}